

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uws_client.c
# Opt level: O0

int ParseStringToDecimal(char *src,int *dst)

{
  long lVar1;
  int *piVar2;
  int *local_28;
  char *next;
  int *piStack_18;
  int result;
  int *dst_local;
  char *src_local;
  
  piStack_18 = dst;
  dst_local = (int *)src;
  lVar1 = strtol(src,(char **)&local_28,0);
  *piStack_18 = (int)lVar1;
  if (dst_local == local_28) {
LAB_0015afb3:
    next._4_4_ = 0x3c8;
  }
  else {
    if ((*piStack_18 == 0x7fffffff) || (*piStack_18 == -0x80000000)) {
      piVar2 = __errno_location();
      if (*piVar2 != 0) goto LAB_0015afb3;
    }
    next._4_4_ = 0;
  }
  return next._4_4_;
}

Assistant:

static int ParseStringToDecimal(const char *src, int* dst)
{
    int result;
    char* next;

    (*dst) = (int)strtol(src, &next, 0);
    if ((src == next) || ((((*dst) == INT_MAX) || ((*dst) == INT_MIN)) && (errno != 0)))
    {
        result = MU_FAILURE;
    }
    else
    {
        result = 0;
    }

    return result;
}